

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeCommit(Btree *p)

{
  int iVar1;
  Btree *in_RDI;
  int rc;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar2;
  
  uVar2 = 0xaaaaaaaa;
  sqlite3BtreeEnter((Btree *)0x19c91b);
  iVar1 = sqlite3BtreeCommitPhaseOne(in_RDI,(char *)CONCAT44(uVar2,in_stack_fffffffffffffff0));
  if (iVar1 == 0) {
    iVar1 = sqlite3BtreeCommitPhaseTwo(in_RDI,0);
  }
  sqlite3BtreeLeave((Btree *)0x19c94e);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCommit(Btree *p){
  int rc;
  sqlite3BtreeEnter(p);
  rc = sqlite3BtreeCommitPhaseOne(p, 0);
  if( rc==SQLITE_OK ){
    rc = sqlite3BtreeCommitPhaseTwo(p, 0);
  }
  sqlite3BtreeLeave(p);
  return rc;
}